

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall
pixels::compareClose(pixels *this,pixels *o,exr_compression_t comp,char *otag,char *selftag)

{
  pointer pfVar1;
  pointer pfVar2;
  bool bVar3;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  char *func;
  char *pcVar7;
  int iVar8;
  pointer puVar9;
  ulong uVar10;
  pointer puVar11;
  pointer puVar12;
  uint16_t *puVar13;
  pointer puVar14;
  uint16_t *puVar15;
  pointer puVar16;
  int y1;
  pointer puVar17;
  uint uVar18;
  pointer puVar19;
  int x1_1;
  uint uVar20;
  int iVar21;
  long lVar22;
  pointer puVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int x1;
  long lVar27;
  pointer puVar28;
  uint uVar29;
  pointer puVar30;
  uint16_t unc [4] [4];
  uint16_t orig [4] [4];
  uint16_t local_78 [16];
  uint16_t local_58 [20];
  
  uVar5 = this->_h;
  if (0 < (int)uVar5) {
    iVar21 = this->_w;
    iVar8 = 0;
    do {
      if (0 < iVar21) {
        lVar26 = 0;
        do {
          lVar27 = (long)this->_stride_x * (long)iVar8 + lVar26;
          iVar21 = (int)lVar26;
          compareExact((o->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar27],
                       (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar27],iVar21,iVar8,otag,selftag,
                       "I");
          pfVar1 = (o->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar2 = (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (comp == EXR_COMPRESSION_PXR24) {
            uVar5 = (((uint)pfVar1[lVar27] >> 8) - ((uint)pfVar2[lVar27] >> 8)) + 1;
            pcVar7 = (char *)(ulong)uVar5;
            if (2 < uVar5) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
              core_test_fail("delta < 2 && delta > -2",(char *)0x247,0x182b71,pcVar7);
            }
          }
          else {
            compareExact(pfVar1[lVar27],pfVar2[lVar27],iVar21,iVar8,otag,selftag,"F");
          }
          iVar21 = this->_w;
          lVar26 = lVar26 + 1;
        } while ((int)lVar26 < iVar21);
        uVar5 = this->_h;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < (int)uVar5);
  }
  if ((comp & ~EXR_COMPRESSION_RLE) == EXR_COMPRESSION_B44) {
    if (0 < (int)uVar5) {
      iVar21 = this->_w;
      uVar29 = 0;
      do {
        if (0 < iVar21) {
          iVar8 = 0;
          do {
            puVar13 = local_78;
            puVar15 = local_58;
            iVar24 = this->_stride_x;
            uVar5 = this->_h - 1;
            uVar6 = iVar21 - 1;
            pcVar7 = (char *)(ulong)uVar6;
            puVar11 = (o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar12 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            lVar26 = 0;
            do {
              uVar18 = (uint)lVar26 | uVar29;
              if ((int)uVar5 < (int)uVar18) {
                uVar18 = uVar5;
              }
              lVar27 = 0;
              do {
                uVar20 = (int)lVar27 + iVar8;
                if ((int)uVar6 < (int)uVar20) {
                  uVar20 = uVar6;
                }
                iVar21 = uVar20 + uVar18 * iVar24;
                puVar15[lVar27] = puVar11[iVar21];
                puVar13[lVar27] = puVar12[iVar21];
                lVar27 = lVar27 + 1;
              } while (lVar27 != 4);
              lVar26 = lVar26 + 1;
              puVar15 = puVar15 + 4;
              puVar13 = puVar13 + 4;
            } while (lVar26 != 4);
            bVar3 = withinB44ErrorBounds((uint16_t (*) [4])local_58,(uint16_t (*) [4])local_78);
            if (!bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar29);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
              core_test_fail("withinB44ErrorBounds (orig, unc)",(char *)0x263,0x182b71,pcVar7);
            }
            lVar26 = 0;
            do {
              puVar13 = local_78;
              puVar15 = local_58;
              uVar5 = this->_h - 1;
              pcVar7 = (char *)(ulong)uVar5;
              iVar24 = this->_w + -1;
              iVar21 = this->_stride_x;
              puVar11 = o->rgba[lVar26].
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar12 = this->rgba[lVar26].
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar27 = 0;
              do {
                uVar6 = (uint)lVar27 | uVar29;
                if ((int)uVar5 < (int)uVar6) {
                  uVar6 = uVar5;
                }
                lVar22 = 0;
                do {
                  iVar25 = (int)lVar22 + iVar8;
                  if (iVar24 < iVar25) {
                    iVar25 = iVar24;
                  }
                  iVar25 = iVar25 + uVar6 * iVar21;
                  puVar15[lVar22] = puVar11[iVar25];
                  puVar13[lVar22] = puVar12[iVar25];
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 4);
                lVar27 = lVar27 + 1;
                puVar15 = puVar15 + 4;
                puVar13 = puVar13 + 4;
              } while (lVar27 != 4);
              bVar3 = withinB44ErrorBounds((uint16_t (*) [4])local_58,(uint16_t (*) [4])local_78);
              if (!bVar3) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar29);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
                core_test_fail("withinB44ErrorBounds (orig, unc)",(char *)0x272,0x182b71,pcVar7);
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 != 4);
            iVar8 = iVar8 + 4;
            iVar21 = this->_w;
          } while (iVar8 < iVar21);
          uVar5 = this->_h;
        }
        uVar29 = uVar29 + 4;
      } while ((int)uVar29 < (int)uVar5);
    }
  }
  else if ((comp & ~EXR_COMPRESSION_RLE) == EXR_COMPRESSION_DWAA) {
    if (0 < (int)uVar5) {
      iVar21 = this->_w;
      pcVar7 = (char *)0x0;
      do {
        iVar8 = (int)pcVar7;
        if (0 < iVar21) {
          iVar24 = 0;
          do {
            lVar27 = (long)(this->_stride_x * iVar8 + iVar24);
            func = pcVar7;
            compareExact((o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar27],
                         (this->h).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],iVar24,iVar8,otag,selftag,"H");
            lVar26 = 0x58;
            do {
              bVar3 = withinDWAErrorBounds
                                (*(uint16_t *)
                                  (*(long *)((long)o->rgba + lVar26 + -0x58) + lVar27 * 2),
                                 *(uint16_t *)
                                  (*(long *)((long)this->rgba + lVar26 + -0x58) + lVar27 * 2));
              if (!bVar3) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"At ",3);
                poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar24);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
                core_test_fail("withinDWAErrorBounds (o.rgba[c][idx], rgba[c][idx])",(char *)0x285,
                               0x182b71,func);
              }
              lVar26 = lVar26 + 0x18;
            } while (lVar26 != 0xb8);
            iVar24 = iVar24 + 1;
            iVar21 = this->_w;
          } while (iVar24 < iVar21);
          uVar5 = this->_h;
        }
        pcVar7 = (char *)(ulong)(iVar8 + 1U);
      } while ((int)(iVar8 + 1U) < (int)uVar5);
    }
  }
  else if (comp == EXR_COMPRESSION_PXR24) {
    if (0 < (int)uVar5) {
      iVar21 = this->_w;
      iVar8 = 0;
      do {
        if (0 < iVar21) {
          lVar26 = 0;
          do {
            lVar27 = (long)this->_stride_x * (long)iVar8 + lVar26;
            iVar21 = (int)lVar26;
            compareExact((o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar27],
                         (this->h).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],iVar21,iVar8,otag,selftag,"H");
            compareExact(o->rgba[0].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],
                         this->rgba[0].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],iVar21,iVar8,otag,selftag,"R");
            compareExact(o->rgba[1].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],
                         this->rgba[1].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],iVar21,iVar8,otag,selftag,"G");
            compareExact(o->rgba[2].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],
                         this->rgba[2].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],iVar21,iVar8,otag,selftag,"B");
            compareExact(o->rgba[3].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],
                         this->rgba[3].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar27],iVar21,iVar8,otag,selftag,"A");
            iVar21 = this->_w;
            lVar26 = lVar26 + 1;
          } while ((int)lVar26 < iVar21);
          uVar5 = this->_h;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < (int)uVar5);
    }
  }
  else if (0 < (int)uVar5) {
    iVar21 = this->_stride_x;
    puVar11 = (o->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar12 = o->rgba[0].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar14 = (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar16 = this->rgba[0].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar17 = o->rgba[1].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar19 = this->rgba[1].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar28 = o->rgba[2].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar30 = this->rgba[2].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar23 = o->rgba[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
              .super__Vector_impl_data._M_start;
    puVar9 = this->rgba[3].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      if (0 < this->_w) {
        pcVar7 = (char *)0x0;
        do {
          if (*(short *)(pcVar7 + (long)puVar11) != *(short *)(pcVar7 + (long)puVar14)) {
            core_test_fail("o.h[idx] == h[idx]",(char *)0x2a4,0x182b71,pcVar7);
          }
          if (*(short *)(pcVar7 + (long)puVar12) != *(short *)(pcVar7 + (long)puVar16)) {
            core_test_fail("o.rgba[0][idx] == rgba[0][idx]",(char *)0x2a5,0x182b71,pcVar7);
          }
          if (*(short *)(pcVar7 + (long)puVar17) != *(short *)(pcVar7 + (long)puVar19)) {
            core_test_fail("o.rgba[1][idx] == rgba[1][idx]",(char *)0x2a6,0x182b71,pcVar7);
          }
          if (*(short *)(pcVar7 + (long)puVar28) != *(short *)(pcVar7 + (long)puVar30)) {
            core_test_fail("o.rgba[2][idx] == rgba[2][idx]",(char *)0x2a7,0x182b71,pcVar7);
          }
          if (*(short *)(pcVar7 + (long)puVar23) != *(short *)(pcVar7 + (long)puVar9)) {
            core_test_fail("o.rgba[3][idx] == rgba[3][idx]",(char *)0x2a8,0x182b71,pcVar7);
          }
          pcVar7 = pcVar7 + 2;
        } while ((char *)((ulong)(uint)this->_w * 2) != pcVar7);
      }
      uVar10 = uVar10 + 1;
      puVar11 = puVar11 + iVar21;
      puVar14 = puVar14 + iVar21;
      puVar12 = puVar12 + iVar21;
      puVar16 = puVar16 + iVar21;
      puVar17 = puVar17 + iVar21;
      puVar19 = puVar19 + iVar21;
      puVar28 = puVar28 + iVar21;
      puVar30 = puVar30 + iVar21;
      puVar23 = puVar23 + iVar21;
      puVar9 = puVar9 + iVar21;
    } while (uVar10 != uVar5);
  }
  return;
}

Assistant:

void compareClose (
        const pixels&     o,
        exr_compression_t comp,
        const char*       otag,
        const char*       selftag) const
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;

                compareExact (o.i[idx], i[idx], x, y, otag, selftag, "I");

                if (comp == EXR_COMPRESSION_PXR24)
                {
                    union
                    {
                        uint32_t iv;
                        float    fv;
                    } a, b;
                    a.fv = o.f[idx];
                    b.fv = f[idx];
                    int32_t delta =
                        (int32_t) (a.iv >> 8) - (int32_t) (b.iv >> 8);
                    EXRCORE_TEST_LOCATION (delta < 2 && delta > -2, x, y);
                }
                else
                {
                    // b44 & dwa don't change floats
                    compareExact (o.f[idx], f[idx], x, y, otag, selftag, "F");
                }
            }
        }

        if (comp == EXR_COMPRESSION_B44 || comp == EXR_COMPRESSION_B44A)
        {
            uint16_t orig[4][4], unc[4][4];
            for (int y = 0; y < _h; y += 4)
            {
                for (int x = 0; x < _w; x += 4)
                {
                    for (int y1 = 0; y1 < 4; ++y1)
                    {
                        for (int x1 = 0; x1 < 4; ++x1)
                        {
                            int y2       = std::min (y + y1, _h - 1);
                            int x2       = std::min (x + x1, _w - 1);
                            orig[y1][x1] = o.h[y2 * _stride_x + x2];
                            unc[y1][x1]  = h[y2 * _stride_x + x2];
                        }
                    }
                    EXRCORE_TEST_LOCATION (
                        withinB44ErrorBounds (orig, unc), x, y)
                    for (int c = 0; c < 4; ++c)
                    {

                        for (int y1 = 0; y1 < 4; ++y1)
                        {
                            for (int x1 = 0; x1 < 4; ++x1)
                            {
                                int y2       = std::min (y + y1, _h - 1);
                                int x2       = std::min (x + x1, _w - 1);
                                orig[y1][x1] = o.rgba[c][y2 * _stride_x + x2];
                                unc[y1][x1]  = rgba[c][y2 * _stride_x + x2];
                            }
                        }
                        EXRCORE_TEST_LOCATION (
                            withinB44ErrorBounds (orig, unc), x, y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_DWAA || comp == EXR_COMPRESSION_DWAB)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");

                    for (int c = 0; c < 4; ++c)
                    {
                        EXRCORE_TEST_LOCATION (
                            withinDWAErrorBounds (o.rgba[c][idx], rgba[c][idx]),
                            x,
                            y)
                    }
                }
            }
        }
        else if (comp == EXR_COMPRESSION_PXR24)
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    compareExact (o.h[idx], h[idx], x, y, otag, selftag, "H");
                    compareExact (
                        o.rgba[0][idx], rgba[0][idx], x, y, otag, selftag, "R");
                    compareExact (
                        o.rgba[1][idx], rgba[1][idx], x, y, otag, selftag, "G");
                    compareExact (
                        o.rgba[2][idx], rgba[2][idx], x, y, otag, selftag, "B");
                    compareExact (
                        o.rgba[3][idx], rgba[3][idx], x, y, otag, selftag, "A");
                }
            }
        }
        else
        {
            for (int y = 0; y < _h; ++y)
            {
                for (int x = 0; x < _w; ++x)
                {
                    size_t idx = y * _stride_x + x;
                    EXRCORE_TEST (o.h[idx] == h[idx]);
                    EXRCORE_TEST (o.rgba[0][idx] == rgba[0][idx]);
                    EXRCORE_TEST (o.rgba[1][idx] == rgba[1][idx]);
                    EXRCORE_TEST (o.rgba[2][idx] == rgba[2][idx]);
                    EXRCORE_TEST (o.rgba[3][idx] == rgba[3][idx]);
                }
            }
        }
    }